

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool __thiscall
picojson::input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::match
          (input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this,string *pattern)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  FILE *__stream;
  char *pcVar4;
  
  pcVar1 = (pattern->_M_dataplus)._M_p;
  __stream = (FILE *)pattern;
  do {
    pcVar3 = pcVar1;
    pcVar4 = (pattern->_M_dataplus)._M_p + pattern->_M_string_length;
    if (pcVar3 == pcVar4) goto LAB_0011805b;
    uVar2 = getc(this,__stream);
    pcVar1 = pcVar3 + 1;
  } while (uVar2 == (int)*pcVar3);
  ungetc(this,(int)__stream,(FILE *)(ulong)(uint)(int)*pcVar3);
LAB_0011805b:
  return pcVar3 == pcVar4;
}

Assistant:

bool match(const std::string& pattern) {
      for (std::string::const_iterator pi(pattern.begin());
       pi != pattern.end();
       ++pi) {
    if (getc() != *pi) {
      ungetc();
      return false;
    }
      }
      return true;
    }